

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall google::protobuf::Message::CopyFrom(Message *this,Message *from)

{
  Descriptor *pDVar1;
  LogMessage *pLVar2;
  string *psVar3;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  Descriptor *local_20;
  Descriptor *descriptor;
  Message *from_local;
  Message *this_local;
  
  descriptor = (Descriptor *)from;
  from_local = this;
  local_20 = GetDescriptor(this);
  pDVar1 = GetDescriptor((Message *)descriptor);
  local_59 = 0;
  if (pDVar1 != local_20) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x50);
    local_59 = 1;
    pLVar2 = internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (from.GetDescriptor()) == (descriptor): ");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,": Tried to copy from a message with a different type. to: ");
    psVar3 = Descriptor::full_name_abi_cxx11_(local_20);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,psVar3);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,", from: ");
    pDVar1 = GetDescriptor((Message *)descriptor);
    psVar3 = Descriptor::full_name_abi_cxx11_(pDVar1);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,psVar3);
    internal::LogFinisher::operator=(local_6d,pLVar2);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  internal::ReflectionOps::Copy((Message *)descriptor,this);
  return;
}

Assistant:

void Message::CopyFrom(const Message& from) {
  const Descriptor* descriptor = GetDescriptor();
  GOOGLE_CHECK_EQ(from.GetDescriptor(), descriptor)
    << ": Tried to copy from a message with a different type. "
       "to: " << descriptor->full_name() << ", "
       "from: " << from.GetDescriptor()->full_name();
  ReflectionOps::Copy(from, this);
}